

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

Vec_Int_t * Gia_ManDfsCollect(Gia_Man_t *p)

{
  Vec_Int_t *vObjs;
  Gia_Obj_t *pGVar1;
  int iVar2;
  
  vObjs = Vec_IntAlloc(p->nObjs);
  Gia_ManIncrementTravId(p);
  iVar2 = 0;
  while ((iVar2 < p->vCos->nSize && (pGVar1 = Gia_ManCo(p,iVar2), pGVar1 != (Gia_Obj_t *)0x0))) {
    Gia_ManDfsCollect_rec(p,pGVar1,vObjs);
    iVar2 = iVar2 + 1;
  }
  iVar2 = 0;
  while( true ) {
    if (p->vCis->nSize <= iVar2) {
      return vObjs;
    }
    pGVar1 = Gia_ManCi(p,iVar2);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    Gia_ManDfsCollect_rec(p,pGVar1,vObjs);
    iVar2 = iVar2 + 1;
  }
  return vObjs;
}

Assistant:

Vec_Int_t * Gia_ManDfsCollect( Gia_Man_t * p )
{
    Vec_Int_t * vObjs = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj; int i;
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDfsCollect_rec( p, pObj, vObjs );
    Gia_ManForEachCi( p, pObj, i )
        Gia_ManDfsCollect_rec( p, pObj, vObjs );
    return vObjs;
}